

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O2

void installMethodsInClass
               (Class cls,SparseArray *methods_to_replace,SparseArray *methods,BOOL replaceExisting)

{
  BOOL BVar1;
  uint in_EAX;
  dtable_t dtable;
  objc_method *method;
  objc_method *method_to_replace;
  BOOL in_R8B;
  uint32_t idx;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  dtable = dtable_for_class(cls);
  if (uninstalled_dtable != dtable) {
    uStack_38 = (ulong)(uint)uStack_38;
    while( true ) {
      method = (objc_method *)SparseArrayNext(methods,(uint32_t *)((long)&uStack_38 + 4));
      if (method == (objc_method *)0x0) break;
      if (methods_to_replace == (SparseArray *)0x0) {
        method_to_replace = (objc_method *)0x0;
      }
      else {
        method_to_replace =
             (objc_method *)
             SparseArrayLookup(methods_to_replace,*(uint32_t *)&method->selector->field_0);
      }
      BVar1 = installMethodInDtable(cls,dtable,method,method_to_replace,in_R8B);
      if (BVar1 == '\0') {
        SparseArrayInsert(methods,uStack_38._4_4_,(void *)0x0);
      }
    }
    return;
  }
  __assert_fail("uninstalled_dtable != dtable",
                "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/dtable.c",
                0x1a6,"void installMethodsInClass(Class, SparseArray *, SparseArray *, BOOL)");
}

Assistant:

static void installMethodsInClass(Class cls,
                                  SparseArray *methods_to_replace,
                                  SparseArray *methods,
                                  BOOL replaceExisting)
{
	SparseArray *dtable = dtable_for_class(cls);
	assert(uninstalled_dtable != dtable);

	uint32_t idx = 0;
	struct objc_method *m;
	while ((m = SparseArrayNext(methods, &idx)))
	{
		struct objc_method *method_to_replace = methods_to_replace
			?  SparseArrayLookup(methods_to_replace, m->selector->index)
			: NULL;
		if (!installMethodInDtable(cls, dtable, m, method_to_replace, replaceExisting))
		{
			// Remove this method from the list, if it wasn't actually installed
			SparseArrayInsert(methods, idx, 0);
		}
	}
}